

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

idx_t duckdb::SortKeyConstantOperator<float>::Encode(data_ptr_t result,TYPE_conflict1 input)

{
  bool bVar1;
  uint uVar2;
  
  if ((input != 0.0) || (uVar2 = 0x80000000, NAN(input))) {
    bVar1 = Value::IsNan<float>(input);
    uVar2 = 0xffffffff;
    if ((!bVar1) &&
       ((uVar2 = 0xfffffffe, input <= 3.4028235e+38 && (uVar2 = 0, -3.4028235e+38 <= input)))) {
      uVar2 = ~(uint)input;
      if (-1 < (int)input) {
        uVar2 = (uint)input | 0x80000000;
      }
    }
  }
  *(uint *)result = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  return 4;
}

Assistant:

static idx_t Encode(data_ptr_t result, TYPE input) {
		Radix::EncodeData<T>(result, input);
		return sizeof(T);
	}